

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttributeTranslator.cpp
# Opt level: O2

void __thiscall
arangodb::velocypack::AttributeTranslator::add
          (AttributeTranslator *this,string_view key,uint64_t id)

{
  undefined8 __p;
  _Head_base<0UL,_arangodb::velocypack::Builder_*,_false> _Var1;
  Value local_40;
  
  _Var1._M_head_impl =
       (this->_builder)._M_t.
       super___uniq_ptr_impl<arangodb::velocypack::Builder,_std::default_delete<arangodb::velocypack::Builder>_>
       ._M_t.
       super__Tuple_impl<0UL,_arangodb::velocypack::Builder_*,_std::default_delete<arangodb::velocypack::Builder>_>
       .super__Head_base<0UL,_arangodb::velocypack::Builder_*,_false>._M_head_impl;
  if (_Var1._M_head_impl == (Builder *)0x0) {
    std::make_unique<arangodb::velocypack::Builder>();
    __p = local_40._0_8_;
    local_40._0_8_ =
         (__uniq_ptr_impl<arangodb::velocypack::Builder,_std::default_delete<arangodb::velocypack::Builder>_>
          )0x0;
    std::
    __uniq_ptr_impl<arangodb::velocypack::Builder,_std::default_delete<arangodb::velocypack::Builder>_>
    ::reset((__uniq_ptr_impl<arangodb::velocypack::Builder,_std::default_delete<arangodb::velocypack::Builder>_>
             *)this,(pointer)__p);
    std::
    unique_ptr<arangodb::velocypack::Builder,_std::default_delete<arangodb::velocypack::Builder>_>::
    ~unique_ptr((unique_ptr<arangodb::velocypack::Builder,_std::default_delete<arangodb::velocypack::Builder>_>
                 *)&local_40);
    _Var1._M_head_impl =
         (this->_builder)._M_t.
         super___uniq_ptr_impl<arangodb::velocypack::Builder,_std::default_delete<arangodb::velocypack::Builder>_>
         ._M_t.
         super__Tuple_impl<0UL,_arangodb::velocypack::Builder_*,_std::default_delete<arangodb::velocypack::Builder>_>
         .super__Head_base<0UL,_arangodb::velocypack::Builder_*,_false>._M_head_impl;
    Value::Value(&local_40,Object,false);
    Builder::addInternal<arangodb::velocypack::Value>(_Var1._M_head_impl,&local_40);
    _Var1._M_head_impl =
         (this->_builder)._M_t.
         super___uniq_ptr_impl<arangodb::velocypack::Builder,_std::default_delete<arangodb::velocypack::Builder>_>
         ._M_t.
         super__Tuple_impl<0UL,_arangodb::velocypack::Builder_*,_std::default_delete<arangodb::velocypack::Builder>_>
         .super__Head_base<0UL,_arangodb::velocypack::Builder_*,_false>._M_head_impl;
  }
  local_40._valueType = 0xc;
  local_40._cType = 4;
  local_40._value.u = id;
  Builder::addInternal<arangodb::velocypack::Value>(_Var1._M_head_impl,key,&local_40);
  this->_count = this->_count + 1;
  return;
}

Assistant:

void AttributeTranslator::add(std::string_view key, uint64_t id) {
  if (_builder == nullptr) {
    _builder = std::make_unique<Builder>();
    _builder->add(Value(ValueType::Object));
  }

  _builder->add(key, Value(id));
  _count++;
}